

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall pegmatite::Context::_parse_non_term(Context *this,Rule *r)

{
  element_type *peVar1;
  char cVar2;
  int iVar3;
  ParserPosition b;
  ParserPosition local_78;
  undefined1 local_60 [16];
  _Manager_type local_50;
  
  (**this->delegate->_vptr_ParserDelegate)((_Function_base *)local_60,this->delegate,r);
  std::_Function_base::~_Function_base((_Function_base *)local_60);
  if (local_50 == (_Manager_type)0x0) {
    peVar1 = (r->expr).super_shared_ptr<pegmatite::Expr>.
             super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar1->_vptr_Expr[2])(peVar1,this);
    cVar2 = (char)iVar3;
  }
  else {
    local_78.line = (this->position).line;
    local_78.col = (this->position).col;
    local_78.it.buffer._0_4_ = *(undefined4 *)&(this->position).it.buffer;
    local_78.it.buffer._4_4_ = *(undefined4 *)((long)&(this->position).it.buffer + 4);
    local_78.it.idx._0_4_ = (undefined4)(this->position).it.idx;
    local_78.it.idx._4_4_ = *(undefined4 *)((long)&(this->position).it.idx + 4);
    peVar1 = (r->expr).super_shared_ptr<pegmatite::Expr>.
             super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar3 = (*peVar1->_vptr_Expr[2])(peVar1,this);
    cVar2 = (char)iVar3;
    if (cVar2 != '\0') {
      local_60._0_8_ = r;
      InputRange::InputRange((InputRange *)(local_60 + 8),&local_78,&this->position);
      std::
      vector<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
      ::push_back(&this->matches,(value_type *)local_60);
    }
  }
  return (bool)cVar2;
}

Assistant:

bool Context::_parse_non_term(const Rule &r)
{
	bool ok;
	if (get_parse_proc(r))
	{
		ParserPosition b = position;
		ok = r.expr->parse_non_term(*this);
		if (debug_parsing)
		{
			r.expr->dump();
			fprintf(stderr, "\n");
		}
		if (ok)
		{
			matches.push_back(ParseMatch(std::addressof(r), b, position));
		}
	}
	else
	{
		ok = r.expr->parse_non_term(*this);
	}
	return ok;
}